

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_parse_url_options(connectdata *conn)

{
  char *first;
  int iVar1;
  char *value_00;
  bool bVar2;
  char *value;
  char *key;
  char *ptr;
  imap_conn *imapc;
  CURLcode result;
  connectdata *conn_local;
  
  imapc._4_4_ = CURLE_OK;
  key = conn->options;
  (conn->proto).ftpc.dont_check = true;
  while( true ) {
    first = key;
    bVar2 = false;
    if ((imapc._4_4_ == CURLE_OK) && (bVar2 = false, key != (char *)0x0)) {
      bVar2 = *key != '\0';
    }
    if (!bVar2) break;
    while( true ) {
      bVar2 = false;
      if (*key != '\0') {
        bVar2 = *key != '=';
      }
      if (!bVar2) break;
      key = key + 1;
    }
    value_00 = key + 1;
    while( true ) {
      bVar2 = false;
      if (*key != '\0') {
        bVar2 = *key != ';';
      }
      if (!bVar2) break;
      key = key + 1;
    }
    iVar1 = curl_strnequal(first,"AUTH=",5);
    if (iVar1 == 0) {
      imapc._4_4_ = CURLE_URL_MALFORMAT;
    }
    else {
      imapc._4_4_ = Curl_sasl_parse_url_auth_option
                              (&(conn->proto).imapc.sasl,value_00,(long)key - (long)value_00);
    }
    if (*key == ';') {
      key = key + 1;
    }
  }
  iVar1 = *(int *)((long)&conn->proto + 0x88);
  if (iVar1 == -0xa1) {
    (conn->proto).imapc.preftype = 0xffffffff;
  }
  else if (iVar1 == 0) {
    (conn->proto).imapc.preftype = 0;
  }
  else {
    (conn->proto).imapc.preftype = 2;
  }
  return imapc._4_4_;
}

Assistant:

static CURLcode imap_parse_url_options(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *ptr = conn->options;

  imapc->sasl.resetprefs = TRUE;

  while(!result && ptr && *ptr) {
    const char *key = ptr;
    const char *value;

    while(*ptr && *ptr != '=')
        ptr++;

    value = ptr + 1;

    while(*ptr && *ptr != ';')
      ptr++;

    if(strnequal(key, "AUTH=", 5))
      result = Curl_sasl_parse_url_auth_option(&imapc->sasl,
                                               value, ptr - value);
    else
      result = CURLE_URL_MALFORMAT;

    if(*ptr == ';')
      ptr++;
  }

  switch(imapc->sasl.prefmech) {
  case SASL_AUTH_NONE:
    imapc->preftype = IMAP_TYPE_NONE;
    break;
  case SASL_AUTH_DEFAULT:
    imapc->preftype = IMAP_TYPE_ANY;
    break;
  default:
    imapc->preftype = IMAP_TYPE_SASL;
    break;
  }

  return result;
}